

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O1

err_t brngCTRRand(void *buf,size_t count,octet *key,octet *iv)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  brng_ctr_st *s;
  
  bVar1 = memIsValid(key,0x20);
  eVar3 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(iv,0x20);
    if (bVar1 != 0) {
      bVar1 = memIsValid(buf,count);
      if (bVar1 != 0) {
        eVar3 = 0;
        sVar2 = beltHash_keep();
        state = blobCreate(sVar2 * 2 + 0x68);
        if (state == (blob_t)0x0) {
          eVar3 = 0x6e;
        }
        else {
          brngCTRStart(state,key,iv);
          brngCTRStepR(buf,count,state);
          memCopy(iv,state,0x20);
          blobClose(state);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t brngCTRRand(void* buf, size_t count, const octet key[32], octet iv[32])
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(iv, 32) ||
		!memIsValid(buf, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngCTR_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngCTRStart(state, key, iv);
	brngCTRStepR(buf, count, state);
	brngCTRStepG(iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}